

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_internal.h
# Opt level: O2

int mbedtls_ssl_safer_memcmp(void *a,void *b,size_t n)

{
  size_t sVar1;
  uchar diff;
  
  diff = '\0';
  for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
    diff = diff | *(byte *)((long)a + sVar1) ^ *(byte *)((long)b + sVar1);
  }
  return (int)diff;
}

Assistant:

static inline int mbedtls_ssl_safer_memcmp( const void *a, const void *b, size_t n )
{
    size_t i;
    volatile const unsigned char *A = (volatile const unsigned char *) a;
    volatile const unsigned char *B = (volatile const unsigned char *) b;
    volatile unsigned char diff = 0;

    for( i = 0; i < n; i++ )
        diff |= A[i] ^ B[i];

    return( diff );
}